

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# einsum.cpp
# Opt level: O0

void __thiscall ncnn::Einsum::Einsum(Einsum *this)

{
  Layer *in_RDI;
  
  Layer::Layer(in_RDI);
  in_RDI->_vptr_Layer = (_func_int **)&PTR__Einsum_01fd8808;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1eecc47);
  std::__cxx11::string::string((string *)&in_RDI[1].support_reserved_6);
  in_RDI->one_blob_only = false;
  in_RDI->support_inplace = false;
  return;
}

Assistant:

Einsum::Einsum()
{
    one_blob_only = false;
    support_inplace = false;
}